

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

learner<mf,_example> * calloc_or_throw<LEARNER::learner<mf,example>>(size_t nmemb)

{
  undefined8 uVar1;
  size_t in_RDI;
  stringstream __msg;
  char *msg;
  void *data;
  string *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  vw_exception *in_stack_fffffffffffffe50;
  stringstream local_1a8 [16];
  ostream local_198;
  char *local_20;
  learner<mf,_example> *local_18;
  learner<mf,_example> *local_8;
  
  if (in_RDI == 0) {
    local_8 = (learner<mf,_example> *)0x0;
  }
  else {
    local_18 = (learner<mf,_example> *)calloc(in_RDI,0xf0);
    local_8 = local_18;
    if (local_18 == (learner<mf,_example> *)0x0) {
      local_20 = "internal error: memory allocation failed!\n";
      fputs("internal error: memory allocation failed!\n",_stderr);
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::operator<<(&local_198,local_20);
      uVar1 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                 in_stack_fffffffffffffe38);
      __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  return local_8;
}

Assistant:

T* calloc_or_throw(size_t nmemb)
{
  if (nmemb == 0)
    return nullptr;

  void* data = calloc(nmemb, sizeof(T));
  if (data == nullptr)
  {
    const char* msg = "internal error: memory allocation failed!\n";
    // use low-level function since we're already out of memory.
    fputs(msg, stderr);
    THROW(msg);
  }
  return (T*)data;
}